

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint64_t *puVar1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int iVar6;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  undefined4 in_register_0000000c;
  secp256k1_ge *psVar10;
  secp256k1_fe *extraout_RDX;
  secp256k1_fe *extraout_RDX_00;
  ulong uVar11;
  ulong extraout_RDX_01;
  secp256k1_ge *a_00;
  secp256k1_ge *a_01;
  uint uVar12;
  secp256k1_ge *unaff_RBX;
  secp256k1_ge *psVar13;
  secp256k1_gej *unaff_RBP;
  secp256k1_gej *psVar14;
  uint64_t uVar15;
  undefined4 in_register_00000034;
  secp256k1_ge *psVar16;
  ulong uVar17;
  secp256k1_gej *psVar18;
  secp256k1_gej *a_02;
  ulong uVar19;
  secp256k1_gej *a_03;
  uint uVar20;
  secp256k1_gej *unaff_R12;
  secp256k1_ge *a_04;
  secp256k1_gej *a_05;
  ulong unaff_R13;
  long lVar21;
  secp256k1_fe *psVar22;
  secp256k1_ge *unaff_R14;
  uint uVar23;
  secp256k1_gej *unaff_R15;
  secp256k1_fe *psVar24;
  secp256k1_gej *a_06;
  secp256k1_scalar s;
  secp256k1_fe sStack_5f0;
  secp256k1_fe sStack_5c0;
  secp256k1_gej *psStack_590;
  secp256k1_gej *psStack_588;
  secp256k1_fe *psStack_580;
  secp256k1_gej *psStack_578;
  secp256k1_gej *psStack_570;
  secp256k1_fe *psStack_560;
  undefined1 auStack_558 [56];
  uint64_t uStack_520;
  uint64_t uStack_518;
  uint64_t uStack_510;
  ulong uStack_508;
  ulong uStack_500;
  undefined1 auStack_4f8 [56];
  uint64_t uStack_4c0;
  uint64_t uStack_4b8;
  uint64_t uStack_4b0;
  ulong uStack_4a8;
  ulong uStack_4a0;
  undefined1 auStack_498 [56];
  uint64_t uStack_460;
  uint64_t uStack_458;
  uint64_t uStack_450;
  uint64_t uStack_448;
  int iStack_440;
  secp256k1_fe sStack_438;
  secp256k1_fe sStack_408;
  secp256k1_fe sStack_3d8;
  secp256k1_fe sStack_3a8;
  undefined1 auStack_378 [96];
  code *pcStack_318;
  secp256k1_ge *psStack_308;
  secp256k1_gej *psStack_300;
  secp256k1_ge *psStack_2f8;
  undefined1 *puStack_2f0;
  secp256k1_gej sStack_2e8;
  secp256k1_ge *psStack_250;
  secp256k1_gej *psStack_248;
  ulong uStack_240;
  secp256k1_ge *psStack_238;
  secp256k1_gej *psStack_230;
  secp256k1_gej *psStack_228;
  secp256k1_fe *psStack_218;
  secp256k1_gej sStack_210;
  secp256k1_gej sStack_178;
  secp256k1_ge sStack_e0;
  secp256k1_ge *psStack_78;
  secp256k1_gej *psStack_70;
  ulong uStack_68;
  secp256k1_ge *psStack_60;
  secp256k1_gej *psStack_58;
  secp256k1_gej *psStack_50;
  uint local_3c;
  int *local_38;
  
  psVar16 = (secp256k1_ge *)CONCAT44(in_register_00000034,len);
  psVar18 = (secp256k1_gej *)CONCAT44(in_register_0000000c,w);
  psVar13 = psVar16;
  local_38 = wnaf;
  if (wnaf == (int *)0x0) goto LAB_0011a42c;
  psVar14 = unaff_RBP;
  unaff_R14 = psVar16;
  if (psVar16 != (secp256k1_ge *)0x0) {
    psVar13 = (secp256k1_ge *)0x0;
    psStack_50 = (secp256k1_gej *)0x11a30b;
    memset(wnaf,0,0x204);
    uVar23 = (uint)(psVar16->x).n[0];
    unaff_R13 = (ulong)uVar23;
    unaff_R14 = (secp256k1_ge *)&stack0xffffffffffffffc4;
    psStack_50 = (secp256k1_gej *)0x11a31e;
    local_3c = uVar23;
    secp256k1_scalar_verify((secp256k1_scalar *)unaff_R14);
    unaff_RBX = (secp256k1_ge *)0x0;
    unaff_RBP = (secp256k1_gej *)0xffffffff;
    unaff_R12 = (secp256k1_gej *)0x0;
    do {
      psVar14 = unaff_R12;
      psStack_50 = (secp256k1_gej *)0x11a330;
      wnaf = (int *)unaff_R14;
      secp256k1_scalar_verify((secp256k1_scalar *)unaff_R14);
      uVar20 = (uint)psVar14;
      psVar18 = psVar14;
      if (((uint)(uVar20 < 0x20) & uVar23 >> ((byte)psVar14 & 0x1f)) == (uint)unaff_RBX) {
        uVar20 = uVar20 + 1;
        psVar14 = unaff_RBP;
      }
      else {
        uVar2 = 0x81 - uVar20;
        if ((int)uVar20 < 0x7e) {
          uVar2 = 4;
        }
        unaff_R15 = (secp256k1_gej *)(ulong)uVar2;
        psStack_50 = (secp256k1_gej *)0x11a36d;
        secp256k1_scalar_verify((secp256k1_scalar *)unaff_R14);
        psStack_50 = (secp256k1_gej *)0x11a375;
        wnaf = (int *)unaff_R14;
        secp256k1_scalar_verify((secp256k1_scalar *)unaff_R14);
        if (uVar2 - 0x21 < 0xffffffe0) {
          psStack_50 = (secp256k1_gej *)0x11a427;
          secp256k1_ecmult_wnaf_cold_1();
          unaff_R12 = psVar14;
          goto LAB_0011a427;
        }
        uVar5 = ((uVar23 >> ((byte)psVar14 & 0x1f)) << (-(char)uVar2 & 0x1fU)) >>
                (-(char)uVar2 & 0x1fU);
        if (0x1f < uVar20) {
          uVar5 = 0;
        }
        uVar5 = uVar5 + (uint)unaff_RBX;
        uVar12 = uVar5 >> 3 & 1;
        unaff_RBX = (secp256k1_ge *)(ulong)uVar12;
        psVar18 = (secp256k1_gej *)(long)(int)uVar20;
        local_38[(long)psVar18] = uVar5 + uVar12 * -0x10;
        uVar20 = uVar2 + uVar20;
      }
      uVar2 = local_3c;
      unaff_R12 = (secp256k1_gej *)(ulong)uVar20;
      unaff_RBP = psVar14;
    } while ((int)uVar20 < 0x81);
    unaff_R15 = unaff_R12;
    if ((int)unaff_RBX == 0) {
      if ((int)uVar20 < 0x100) {
        unaff_RBX = (secp256k1_ge *)&stack0xffffffffffffffc4;
        unaff_R14 = (secp256k1_ge *)(ulong)local_3c;
        psVar18 = unaff_R12;
        do {
          psStack_50 = (secp256k1_gej *)0x11a3ee;
          wnaf = (int *)unaff_RBX;
          secp256k1_scalar_verify((secp256k1_scalar *)unaff_RBX);
          if (((uint)psVar18 < 0x20) &&
             (unaff_R15 = psVar18, (1 << ((byte)psVar18 & 0x1f) & uVar2) != 0)) goto LAB_0011a427;
          uVar23 = (uint)psVar18 + 1;
          psVar18 = (secp256k1_gej *)(ulong)uVar23;
        } while (uVar23 != 0x100);
      }
      return (int)psVar14 + 1;
    }
    goto LAB_0011a436;
  }
  goto LAB_0011a431;
LAB_0011a427:
  psStack_50 = (secp256k1_gej *)0x11a42c;
  secp256k1_ecmult_wnaf_cold_3();
LAB_0011a42c:
  psStack_50 = (secp256k1_gej *)0x11a431;
  secp256k1_ecmult_wnaf_cold_5();
  psVar14 = unaff_RBP;
LAB_0011a431:
  psStack_50 = (secp256k1_gej *)0x11a436;
  secp256k1_ecmult_wnaf_cold_4();
LAB_0011a436:
  psStack_50 = (secp256k1_gej *)secp256k1_ecmult_odd_multiples_table;
  secp256k1_ecmult_wnaf_cold_2();
  psStack_78 = unaff_RBX;
  psStack_70 = unaff_R12;
  uStack_68 = unaff_R13;
  psStack_60 = unaff_R14;
  psStack_58 = unaff_R15;
  psStack_50 = psVar14;
  if (psVar18->infinity == 0) {
    psStack_228 = (secp256k1_gej *)0x11a47c;
    psStack_218 = extraout_RDX;
    secp256k1_gej_double_var(&sStack_178,psVar18,(secp256k1_fe *)0x0);
    psStack_228 = (secp256k1_gej *)0x11a497;
    secp256k1_ge_set_xy(&sStack_e0,&sStack_178.x,&sStack_178.y);
    psStack_228 = (secp256k1_gej *)0x11a4ad;
    secp256k1_ge_set_gej_zinv((secp256k1_ge *)wnaf,psVar18,&sStack_178.z);
    psStack_228 = (secp256k1_gej *)0x11a4bd;
    secp256k1_gej_set_ge(&sStack_210,(secp256k1_ge *)wnaf);
    sStack_210.z.n[0] = (psVar18->z).n[0];
    sStack_210.z.n[1] = (psVar18->z).n[1];
    sStack_210.z.n[2] = (psVar18->z).n[2];
    sStack_210.z.n[3] = (psVar18->z).n[3];
    sStack_210.z.n[4] = (psVar18->z).n[4];
    sStack_210.z.magnitude = (psVar18->z).magnitude;
    sStack_210.z.normalized = (psVar18->z).normalized;
    (psVar13->x).n[4] = sStack_178.z.n[4];
    (psVar13->x).magnitude = sStack_178.z.magnitude;
    (psVar13->x).normalized = sStack_178.z.normalized;
    (psVar13->x).n[2] = sStack_178.z.n[2];
    (psVar13->x).n[3] = sStack_178.z.n[3];
    (psVar13->x).n[0] = sStack_178.z.n[0];
    (psVar13->x).n[1] = sStack_178.z.n[1];
    lVar21 = 0x30;
    do {
      wnaf = (int *)((long)wnaf + 0x68);
      psStack_228 = (secp256k1_gej *)0x11a51a;
      secp256k1_gej_add_ge_var
                (&sStack_210,&sStack_210,&sStack_e0,(secp256k1_fe *)((long)(psVar13->x).n + lVar21))
      ;
      psStack_228 = (secp256k1_gej *)0x11a528;
      secp256k1_ge_set_xy((secp256k1_ge *)wnaf,&sStack_210.x,&sStack_210.y);
      lVar21 = lVar21 + 0x30;
    } while (lVar21 != 0xc0);
    psStack_228 = (secp256k1_gej *)0x11a550;
    secp256k1_fe_mul(psStack_218,&sStack_210.z,&sStack_178.z);
    return extraout_EAX;
  }
  psStack_228 = (secp256k1_gej *)secp256k1_ge_table_set_globalz;
  secp256k1_ecmult_odd_multiples_table_cold_1();
  psVar16 = psVar13;
  psVar22 = extraout_RDX_00;
  iVar6 = extraout_EAX_00;
  psStack_2f8 = (secp256k1_ge *)wnaf;
  psStack_250 = unaff_RBX;
  psStack_248 = unaff_R12;
  uStack_240 = unaff_R13;
  psStack_238 = unaff_R14;
  psStack_230 = unaff_R15;
  psStack_228 = psVar14;
  if ((secp256k1_ge *)wnaf != (secp256k1_ge *)0x0) {
    do {
      psStack_300 = (secp256k1_gej *)0x11a59c;
      secp256k1_ge_verify(psVar16);
      psStack_300 = (secp256k1_gej *)0x11a5a4;
      secp256k1_fe_verify(psVar22);
      psVar22 = psVar22 + 1;
      wnaf = (int *)&((secp256k1_ge *)((long)wnaf + -0x68))->field_0x67;
      psVar16 = psVar16 + 1;
    } while (wnaf != (int *)0x0);
    psVar22 = (secp256k1_fe *)&psStack_2f8[-1].field_0x67;
    psVar24 = &psVar13[(long)psVar22].y;
    psStack_300 = (secp256k1_gej *)0x11a5cd;
    secp256k1_fe_verify(psVar24);
    uVar9 = psVar13[(long)psVar22].y.n[4];
    uVar11 = (uVar9 >> 0x30) * 0x1000003d1 + psVar24->n[0];
    uVar7 = (uVar11 >> 0x34) + psVar13[(long)psVar22].y.n[1];
    uVar17 = (uVar7 >> 0x34) + psVar13[(long)psVar22].y.n[2];
    uVar19 = (uVar17 >> 0x34) + psVar13[(long)psVar22].y.n[3];
    psVar18 = (secp256k1_gej *)(uVar17 & 0xfffffffffffff);
    psVar24->n[0] = uVar11 & 0xfffffffffffff;
    psVar13[(long)psVar22].y.n[1] = uVar7 & 0xfffffffffffff;
    psVar13[(long)psVar22].y.n[2] = (uint64_t)psVar18;
    psVar13[(long)psVar22].y.n[3] = uVar19 & 0xfffffffffffff;
    psVar13[(long)psVar22].y.n[4] = (uVar19 >> 0x34) + (uVar9 & 0xffffffffffff);
    psVar13[(long)psVar22].y.magnitude = 1;
    psStack_300 = (secp256k1_gej *)0x11a662;
    secp256k1_fe_verify(psVar24);
    sStack_2e8.x.n[0] = extraout_RDX_00[(long)psVar22].n[0];
    sStack_2e8.x.n[1] = extraout_RDX_00[(long)psVar22].n[1];
    sStack_2e8.x.n[2] = extraout_RDX_00[(long)psVar22].n[2];
    sStack_2e8.x.n[3] = (extraout_RDX_00[(long)psVar22].n + 2)[1];
    sStack_2e8.x.n[4] = extraout_RDX_00[(long)psVar22].n[4];
    sStack_2e8.x._40_8_ = (extraout_RDX_00[(long)psVar22].n + 4)[1];
    psVar16 = psStack_2f8;
    puStack_2f0 = (undefined1 *)psVar22;
    if (psVar22 != (secp256k1_fe *)0x0) {
      a_04 = psVar13 + (long)&psStack_2f8[-1].field_0x66;
      psVar24 = extraout_RDX_00 + (long)psStack_2f8;
      uVar15 = 0;
      psVar10 = psStack_2f8;
      do {
        psVar24 = psVar24 + -1;
        if (uVar15 != 0) {
          psStack_300 = (secp256k1_gej *)0x11a6db;
          psVar18 = &sStack_2e8;
          secp256k1_fe_mul(&sStack_2e8.x,&sStack_2e8.x,psVar24);
        }
        psStack_300 = (secp256k1_gej *)0x11a6e3;
        secp256k1_ge_verify(a_04);
        psStack_300 = (secp256k1_gej *)0x11a6eb;
        psVar14 = &sStack_2e8;
        secp256k1_fe_verify(&sStack_2e8.x);
        if (a_04->infinity != 0) {
          psStack_300 = (secp256k1_gej *)secp256k1_ecmult_table_get_ge_storage;
          secp256k1_ge_table_set_globalz_cold_1();
          psStack_308 = psVar13;
          psStack_300 = &sStack_2e8;
          if ((extraout_RDX_01 & 1) == 0) {
            pcStack_318 = (code *)0x11a847;
            secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_0011a847:
            pcStack_318 = (code *)0x11a84c;
            secp256k1_ecmult_table_get_ge_storage_cold_2();
          }
          else {
            uVar23 = (uint)extraout_RDX_01;
            if ((int)uVar23 < -7) goto LAB_0011a847;
            if ((int)uVar23 < 8) {
              if (0 < (int)uVar23) {
                secp256k1_ge_from_storage
                          ((secp256k1_ge *)psVar14,
                           (secp256k1_ge_storage *)
                           ((long)&psVar18->x + (ulong)(uVar23 - 1 >> 1) * 0x40));
                return extraout_EAX_02;
              }
              pcStack_318 = (code *)0x11a7d4;
              secp256k1_ge_from_storage
                        ((secp256k1_ge *)psVar14,
                         (secp256k1_ge_storage *)((long)&psVar18->x + (ulong)(~uVar23 >> 1) * 0x40))
              ;
              psVar22 = &psVar14->y;
              pcStack_318 = (code *)0x11a7e0;
              secp256k1_fe_verify(psVar22);
              pcStack_318 = (code *)0x11a7ed;
              secp256k1_fe_verify_magnitude(psVar22,1);
              uVar15 = (psVar14->y).n[1];
              uVar3 = (psVar14->y).n[2];
              uVar4 = (psVar14->y).n[3];
              (psVar14->y).n[0] = 0x3ffffbfffff0bc - (psVar14->y).n[0];
              (psVar14->y).n[1] = 0x3ffffffffffffc - uVar15;
              (psVar14->y).n[2] = 0x3ffffffffffffc - uVar3;
              (psVar14->y).n[3] = 0x3ffffffffffffc - uVar4;
              (psVar14->y).n[4] = 0x3fffffffffffc - (psVar14->y).n[4];
              (psVar14->y).magnitude = 2;
              (psVar14->y).normalized = 0;
              secp256k1_fe_verify(psVar22);
              return extraout_EAX_03;
            }
          }
          pcStack_318 = secp256k1_gej_add_zinv_var;
          secp256k1_ecmult_table_get_ge_storage_cold_1();
          psStack_570 = (secp256k1_gej *)0x11a876;
          auStack_378._56_8_ = psVar13;
          auStack_378._64_8_ = a_04;
          auStack_378._72_8_ = psVar22;
          auStack_378._80_8_ = &sStack_2e8;
          auStack_378._88_8_ = psVar24;
          pcStack_318 = (code *)uVar15;
          secp256k1_gej_verify(psVar18);
          psStack_570 = (secp256k1_gej *)0x11a87e;
          secp256k1_ge_verify(a_00);
          psStack_570 = (secp256k1_gej *)0x11a886;
          secp256k1_fe_verify(&psVar10->x);
          if (psVar18->infinity != 0) {
            psVar14->infinity = a_00->infinity;
            psStack_570 = (secp256k1_gej *)0x11a8b2;
            secp256k1_fe_sqr(&sStack_438,&psVar10->x);
            psStack_570 = (secp256k1_gej *)0x11a8c8;
            secp256k1_fe_mul(&sStack_3a8,&sStack_438,&psVar10->x);
            psStack_570 = (secp256k1_gej *)0x11a8d6;
            secp256k1_fe_mul(&psVar14->x,&a_00->x,&sStack_438);
            psStack_570 = (secp256k1_gej *)0x11a8e9;
            secp256k1_fe_mul(&psVar14->y,&a_00->y,&sStack_3a8);
            psVar18 = (secp256k1_gej *)&psVar14->z;
            (psVar14->z).n[0] = 1;
            (psVar14->z).n[1] = 0;
            (psVar14->z).n[2] = 0;
            (psVar14->z).n[3] = 0;
            (psVar14->z).n[4] = 0;
            (psVar14->z).magnitude = 1;
            (psVar14->z).normalized = 1;
LAB_0011a914:
            psStack_570 = (secp256k1_gej *)0x11a919;
            secp256k1_fe_verify(&psVar18->x);
            psStack_570 = (secp256k1_gej *)0x11a921;
            secp256k1_gej_verify(psVar14);
            return extraout_EAX_04;
          }
          if (a_00->infinity != 0) {
            pvVar8 = memcpy(psVar14,psVar18,0x98);
            return (int)pvVar8;
          }
          psStack_560 = &psVar18->z;
          psStack_570 = (secp256k1_gej *)0x11a978;
          secp256k1_fe_mul(&sStack_438,psStack_560,&psVar10->x);
          psVar22 = &sStack_3a8;
          psStack_570 = (secp256k1_gej *)0x11a98b;
          secp256k1_fe_sqr(psVar22,&sStack_438);
          sStack_3d8.n[0] = (psVar18->x).n[0];
          sStack_3d8.n[1] = (psVar18->x).n[1];
          sStack_3d8.n[2] = (psVar18->x).n[2];
          sStack_3d8.n[3] = (psVar18->x).n[3];
          sStack_3d8.n[4] = (psVar18->x).n[4];
          sStack_3d8.magnitude = (psVar18->x).magnitude;
          sStack_3d8.normalized = (psVar18->x).normalized;
          psStack_570 = (secp256k1_gej *)0x11a9c0;
          secp256k1_fe_mul((secp256k1_fe *)(auStack_498 + 0x30),&a_00->x,psVar22);
          auStack_4f8._0_8_ = (psVar18->y).n[0];
          auStack_4f8._8_8_ = (psVar18->y).n[1];
          auStack_4f8._16_8_ = (psVar18->y).n[2];
          auStack_4f8._24_8_ = (psVar18->y).n[3];
          auStack_4f8._32_8_ = (psVar18->y).n[4];
          auStack_4f8._40_4_ = (psVar18->y).magnitude;
          auStack_4f8._44_4_ = (psVar18->y).normalized;
          psStack_570 = (secp256k1_gej *)0x11a9fe;
          secp256k1_fe_mul(&sStack_408,&a_00->y,psVar22);
          psStack_570 = (secp256k1_gej *)0x11aa11;
          secp256k1_fe_mul(&sStack_408,&sStack_408,&sStack_438);
          psStack_570 = (secp256k1_gej *)0x11aa19;
          secp256k1_fe_verify(&sStack_3d8);
          a_02 = (secp256k1_gej *)0x4;
          psStack_570 = (secp256k1_gej *)0x11aa26;
          secp256k1_fe_verify_magnitude(&sStack_3d8,4);
          auStack_4f8._48_8_ = 0x9ffff5ffffd9d6 - sStack_3d8.n[0];
          uStack_4c0 = 0x9ffffffffffff6 - sStack_3d8.n[1];
          a_06 = (secp256k1_gej *)(auStack_4f8 + 0x30);
          uStack_4b8 = 0x9ffffffffffff6 - sStack_3d8.n[2];
          uStack_4b0 = 0x9ffffffffffff6 - sStack_3d8.n[3];
          uStack_4a8 = 0x9fffffffffff6 - sStack_3d8.n[4];
          uStack_4a0 = 5;
          psStack_570 = (secp256k1_gej *)0x11aa75;
          secp256k1_fe_verify((secp256k1_fe *)a_06);
          psStack_570 = (secp256k1_gej *)0x11aa7d;
          secp256k1_fe_verify((secp256k1_fe *)a_06);
          a_05 = (secp256k1_gej *)(auStack_498 + 0x30);
          psStack_570 = (secp256k1_gej *)0x11aa8d;
          a_03 = a_05;
          secp256k1_fe_verify((secp256k1_fe *)a_05);
          if (iStack_440 + (int)uStack_4a0 < 0x21) {
            auStack_4f8._48_8_ = auStack_4f8._48_8_ + auStack_498._48_8_;
            uStack_4c0 = uStack_4c0 + uStack_460;
            uStack_4b8 = uStack_4b8 + uStack_458;
            uStack_4b0 = uStack_4b0 + uStack_450;
            uStack_4a8 = uStack_4a8 + uStack_448;
            psVar22 = (secp256k1_fe *)0x3fffffffffffc;
            uStack_4a0 = (ulong)(uint)(iStack_440 + (int)uStack_4a0);
            psStack_570 = (secp256k1_gej *)0x11aaf0;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_4f8 + 0x30));
            psStack_570 = (secp256k1_gej *)0x11ab00;
            secp256k1_fe_verify(&sStack_408);
            a_02 = (secp256k1_gej *)0x1;
            psStack_570 = (secp256k1_gej *)0x11ab0d;
            secp256k1_fe_verify_magnitude(&sStack_408,1);
            auStack_558._48_8_ = 0x3ffffbfffff0bc - sStack_408.n[0];
            uStack_520 = 0x3ffffffffffffc - sStack_408.n[1];
            a_05 = (secp256k1_gej *)(auStack_558 + 0x30);
            uStack_518 = 0x3ffffffffffffc - sStack_408.n[2];
            uStack_510 = 0x3ffffffffffffc - sStack_408.n[3];
            uStack_508 = 0x3fffffffffffc - sStack_408.n[4];
            uStack_500 = 2;
            psStack_570 = (secp256k1_gej *)0x11ab57;
            secp256k1_fe_verify((secp256k1_fe *)a_05);
            psStack_570 = (secp256k1_gej *)0x11ab5f;
            secp256k1_fe_verify((secp256k1_fe *)a_05);
            a_06 = (secp256k1_gej *)auStack_4f8;
            psStack_570 = (secp256k1_gej *)0x11ab6c;
            a_03 = a_06;
            secp256k1_fe_verify((secp256k1_fe *)a_06);
            if (0x20 < auStack_4f8._40_4_ + (int)uStack_500) goto LAB_0011b038;
            auStack_558._48_8_ = auStack_558._48_8_ + auStack_4f8._0_8_;
            uStack_520 = uStack_520 + auStack_4f8._8_8_;
            uStack_518 = uStack_518 + auStack_4f8._16_8_;
            uStack_510 = uStack_510 + auStack_4f8._24_8_;
            uStack_508 = uStack_508 + auStack_4f8._32_8_;
            uStack_500 = (ulong)(uint)(auStack_4f8._40_4_ + (int)uStack_500);
            psStack_570 = (secp256k1_gej *)0x11abd3;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_558 + 0x30));
            psStack_570 = (secp256k1_gej *)0x11abe3;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_4f8 + 0x30));
            uVar9 = (uStack_4a8 >> 0x30) * 0x1000003d1 + auStack_4f8._48_8_;
            if (((uVar9 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar9 & 0xfffffffffffff) == 0))
            {
              uVar7 = (uVar9 >> 0x34) + uStack_4c0;
              uVar11 = (uVar7 >> 0x34) + uStack_4b8;
              uVar17 = (uVar11 >> 0x34) + uStack_4b0;
              uVar19 = (uVar17 >> 0x34) + (uStack_4a8 & 0xffffffffffff);
              if ((((uVar7 | uVar9 | uVar11 | uVar17) & 0xfffffffffffff) == 0 && uVar19 == 0) ||
                 (((uVar9 | 0x1000003d0) & uVar7 & uVar11 & uVar17 & (uVar19 ^ 0xf000000000000)) ==
                  0xfffffffffffff)) {
                psStack_570 = (secp256k1_gej *)0x11af75;
                secp256k1_fe_verify((secp256k1_fe *)(auStack_558 + 0x30));
                uVar9 = (uStack_508 >> 0x30) * 0x1000003d1 + auStack_558._48_8_;
                if (((uVar9 & 0xfffffffffffff) == 0xffffefffffc2f) ||
                   ((uVar9 & 0xfffffffffffff) == 0)) {
                  uVar7 = (uVar9 >> 0x34) + uStack_520;
                  uVar11 = (uVar7 >> 0x34) + uStack_518;
                  uVar17 = (uVar11 >> 0x34) + uStack_510;
                  uVar19 = (uVar17 >> 0x34) + (uStack_508 & 0xffffffffffff);
                  if ((((uVar7 | uVar9 | uVar11 | uVar17) & 0xfffffffffffff) == 0 && uVar19 == 0) ||
                     (((uVar9 | 0x1000003d0) & uVar7 & uVar11 & uVar17 & (uVar19 ^ 0xf000000000000))
                      == 0xfffffffffffff)) {
                    psStack_570 = (secp256k1_gej *)0x11b02e;
                    secp256k1_gej_double_var(psVar14,psVar18,(secp256k1_fe *)0x0);
                    return extraout_EAX_06;
                  }
                }
                psStack_570 = (secp256k1_gej *)0x11b01c;
                secp256k1_gej_set_infinity(psVar14);
                return extraout_EAX_05;
              }
            }
            psVar14->infinity = 0;
            a_06 = (secp256k1_gej *)(auStack_4f8 + 0x30);
            psStack_570 = (secp256k1_gej *)0x11acc0;
            secp256k1_fe_mul(&psVar14->z,psStack_560,(secp256k1_fe *)a_06);
            psVar18 = (secp256k1_gej *)auStack_378;
            psStack_570 = (secp256k1_gej *)0x11acd3;
            secp256k1_fe_sqr((secp256k1_fe *)psVar18,(secp256k1_fe *)a_06);
            psStack_570 = (secp256k1_gej *)0x11acdb;
            secp256k1_fe_verify((secp256k1_fe *)psVar18);
            psStack_570 = (secp256k1_gej *)0x11ace8;
            secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar18,1);
            auStack_378._0_8_ = 0x3ffffbfffff0bc - auStack_378._0_8_;
            auStack_378._8_8_ = 0x3ffffffffffffc - auStack_378._8_8_;
            auStack_378._16_8_ = 0x3ffffffffffffc - auStack_378._16_8_;
            auStack_378._24_8_ = 0x3ffffffffffffc - auStack_378._24_8_;
            psVar22 = (secp256k1_fe *)(0x3fffffffffffc - auStack_378._32_8_);
            auStack_378._40_4_ = 2;
            auStack_378._44_4_ = 0;
            psStack_570 = (secp256k1_gej *)0x11ad26;
            auStack_378._32_8_ = psVar22;
            secp256k1_fe_verify((secp256k1_fe *)psVar18);
            a_05 = (secp256k1_gej *)auStack_558;
            psStack_570 = (secp256k1_gej *)0x11ad39;
            secp256k1_fe_mul((secp256k1_fe *)a_05,(secp256k1_fe *)psVar18,(secp256k1_fe *)a_06);
            psStack_570 = (secp256k1_gej *)0x11ad51;
            secp256k1_fe_mul((secp256k1_fe *)auStack_498,&sStack_3d8,(secp256k1_fe *)psVar18);
            a_02 = (secp256k1_gej *)(auStack_558 + 0x30);
            psStack_570 = (secp256k1_gej *)0x11ad5e;
            secp256k1_fe_sqr(&psVar14->x,(secp256k1_fe *)a_02);
            psStack_570 = (secp256k1_gej *)0x11ad66;
            secp256k1_fe_verify(&psVar14->x);
            psStack_570 = (secp256k1_gej *)0x11ad6e;
            a_03 = a_05;
            secp256k1_fe_verify((secp256k1_fe *)a_05);
            iVar6 = auStack_558._40_4_ + (psVar14->x).magnitude;
            if (0x20 < iVar6) goto LAB_0011b03d;
            uVar15 = (psVar14->x).n[1];
            uVar3 = (psVar14->x).n[2];
            uVar4 = (psVar14->x).n[3];
            (psVar14->x).n[0] = (psVar14->x).n[0] + auStack_558._0_8_;
            (psVar14->x).n[1] = uVar15 + auStack_558._8_8_;
            (psVar14->x).n[2] = uVar3 + auStack_558._16_8_;
            (psVar14->x).n[3] = uVar4 + auStack_558._24_8_;
            puVar1 = (psVar14->x).n + 4;
            *puVar1 = *puVar1 + auStack_558._32_8_;
            (psVar14->x).magnitude = iVar6;
            (psVar14->x).normalized = 0;
            psStack_570 = (secp256k1_gej *)0x11adb8;
            secp256k1_fe_verify(&psVar14->x);
            psStack_570 = (secp256k1_gej *)0x11adc0;
            secp256k1_fe_verify(&psVar14->x);
            psVar18 = (secp256k1_gej *)auStack_498;
            psStack_570 = (secp256k1_gej *)0x11add0;
            a_03 = psVar18;
            secp256k1_fe_verify((secp256k1_fe *)psVar18);
            iVar6 = auStack_498._40_4_ + (psVar14->x).magnitude;
            if (0x20 < iVar6) goto LAB_0011b042;
            uVar15 = (psVar14->x).n[1];
            uVar3 = (psVar14->x).n[2];
            uVar4 = (psVar14->x).n[3];
            psVar18 = (secp256k1_gej *)auStack_498;
            (psVar14->x).n[0] = (psVar14->x).n[0] + auStack_498._0_8_;
            (psVar14->x).n[1] = uVar15 + auStack_498._8_8_;
            (psVar14->x).n[2] = uVar3 + auStack_498._16_8_;
            (psVar14->x).n[3] = uVar4 + auStack_498._24_8_;
            puVar1 = (psVar14->x).n + 4;
            *puVar1 = *puVar1 + auStack_498._32_8_;
            (psVar14->x).magnitude = iVar6;
            (psVar14->x).normalized = 0;
            psStack_570 = (secp256k1_gej *)0x11ae1f;
            secp256k1_fe_verify(&psVar14->x);
            psStack_570 = (secp256k1_gej *)0x11ae27;
            secp256k1_fe_verify(&psVar14->x);
            psStack_570 = (secp256k1_gej *)0x11ae2f;
            a_03 = psVar18;
            secp256k1_fe_verify((secp256k1_fe *)psVar18);
            iVar6 = auStack_498._40_4_ + (psVar14->x).magnitude;
            if (0x20 < iVar6) goto LAB_0011b047;
            uVar15 = (psVar14->x).n[1];
            uVar3 = (psVar14->x).n[2];
            uVar4 = (psVar14->x).n[3];
            psVar18 = (secp256k1_gej *)auStack_498;
            (psVar14->x).n[0] = (psVar14->x).n[0] + auStack_498._0_8_;
            (psVar14->x).n[1] = uVar15 + auStack_498._8_8_;
            (psVar14->x).n[2] = uVar3 + auStack_498._16_8_;
            (psVar14->x).n[3] = uVar4 + auStack_498._24_8_;
            puVar1 = (psVar14->x).n + 4;
            *puVar1 = *puVar1 + auStack_498._32_8_;
            (psVar14->x).magnitude = iVar6;
            (psVar14->x).normalized = 0;
            psStack_570 = (secp256k1_gej *)0x11ae7e;
            secp256k1_fe_verify(&psVar14->x);
            psStack_570 = (secp256k1_gej *)0x11ae86;
            secp256k1_fe_verify((secp256k1_fe *)psVar18);
            psStack_570 = (secp256k1_gej *)0x11ae8e;
            a_03 = psVar14;
            secp256k1_fe_verify(&psVar14->x);
            iVar6 = (psVar14->x).magnitude + auStack_498._40_4_;
            if (iVar6 < 0x21) {
              auStack_498._0_8_ = (psVar14->x).n[0] + auStack_498._0_8_;
              auStack_498._8_8_ = (psVar14->x).n[1] + auStack_498._8_8_;
              auStack_498._16_8_ = (psVar14->x).n[2] + auStack_498._16_8_;
              auStack_498._24_8_ = (psVar14->x).n[3] + auStack_498._24_8_;
              auStack_498._32_8_ = auStack_498._32_8_ + (psVar14->x).n[4];
              auStack_498._44_4_ = 0;
              psStack_570 = (secp256k1_gej *)0x11aee1;
              auStack_498._40_4_ = iVar6;
              secp256k1_fe_verify((secp256k1_fe *)auStack_498);
              psVar18 = (secp256k1_gej *)&psVar14->y;
              psStack_570 = (secp256k1_gej *)0x11aef5;
              secp256k1_fe_mul((secp256k1_fe *)psVar18,(secp256k1_fe *)auStack_498,
                               (secp256k1_fe *)(auStack_558 + 0x30));
              a_06 = (secp256k1_gej *)auStack_558;
              psStack_570 = (secp256k1_gej *)0x11af0a;
              a_02 = a_06;
              secp256k1_fe_mul((secp256k1_fe *)a_06,(secp256k1_fe *)a_06,(secp256k1_fe *)auStack_4f8
                              );
              psStack_570 = (secp256k1_gej *)0x11af12;
              secp256k1_fe_verify((secp256k1_fe *)psVar18);
              psStack_570 = (secp256k1_gej *)0x11af1a;
              a_03 = a_06;
              secp256k1_fe_verify((secp256k1_fe *)a_06);
              iVar6 = auStack_558._40_4_ + (psVar14->y).magnitude;
              if (iVar6 < 0x21) {
                uVar15 = (psVar14->y).n[1];
                uVar3 = (psVar14->y).n[2];
                uVar4 = (psVar14->y).n[3];
                (psVar14->y).n[0] = (psVar14->y).n[0] + auStack_558._0_8_;
                (psVar14->y).n[1] = uVar15 + auStack_558._8_8_;
                (psVar14->y).n[2] = uVar3 + auStack_558._16_8_;
                (psVar14->y).n[3] = uVar4 + auStack_558._24_8_;
                puVar1 = (psVar14->y).n + 4;
                *puVar1 = *puVar1 + auStack_558._32_8_;
                (psVar14->y).magnitude = iVar6;
                (psVar14->y).normalized = 0;
                goto LAB_0011a914;
              }
              goto LAB_0011b051;
            }
          }
          else {
            psStack_570 = (secp256k1_gej *)0x11b038;
            secp256k1_gej_add_zinv_var_cold_7();
LAB_0011b038:
            psStack_570 = (secp256k1_gej *)0x11b03d;
            secp256k1_gej_add_zinv_var_cold_6();
LAB_0011b03d:
            psStack_570 = (secp256k1_gej *)0x11b042;
            secp256k1_gej_add_zinv_var_cold_5();
LAB_0011b042:
            psStack_570 = (secp256k1_gej *)0x11b047;
            secp256k1_gej_add_zinv_var_cold_4();
LAB_0011b047:
            psStack_570 = (secp256k1_gej *)0x11b04c;
            secp256k1_gej_add_zinv_var_cold_3();
          }
          psStack_570 = (secp256k1_gej *)0x11b051;
          secp256k1_gej_add_zinv_var_cold_2();
LAB_0011b051:
          psStack_570 = (secp256k1_gej *)secp256k1_ge_set_gej_zinv;
          secp256k1_gej_add_zinv_var_cold_1();
          psStack_590 = psVar14;
          psStack_588 = a_05;
          psStack_580 = psVar22;
          psStack_578 = psVar18;
          psStack_570 = a_06;
          secp256k1_gej_verify(a_02);
          psVar13 = a_01;
          secp256k1_fe_verify(&a_01->x);
          if (a_02->infinity == 0) {
            secp256k1_fe_sqr(&sStack_5c0,&a_01->x);
            secp256k1_fe_mul(&sStack_5f0,&sStack_5c0,&a_01->x);
            secp256k1_fe_mul(&a_03->x,&a_02->x,&sStack_5c0);
            secp256k1_fe_mul(&a_03->y,&a_02->y,&sStack_5f0);
            *(int *)(a_03->z).n = a_02->infinity;
            secp256k1_ge_verify((secp256k1_ge *)a_03);
            return extraout_EAX_07;
          }
          secp256k1_ge_set_gej_zinv_cold_1();
          psVar13->infinity = 1;
          (psVar13->x).n[0] = 0;
          (psVar13->x).n[1] = 0;
          (psVar13->x).n[2] = 0;
          (psVar13->x).n[3] = 0;
          *(undefined8 *)((long)(psVar13->x).n + 0x1c) = 0;
          *(undefined8 *)((long)(psVar13->x).n + 0x24) = 0;
          (psVar13->x).normalized = 1;
          secp256k1_fe_verify(&psVar13->x);
          *(undefined8 *)((long)(psVar13->y).n + 0x1c) = 0;
          *(undefined8 *)((long)(psVar13->y).n + 0x24) = 0;
          (psVar13->y).n[2] = 0;
          (psVar13->y).n[3] = 0;
          (psVar13->y).n[0] = 0;
          (psVar13->y).n[1] = 0;
          (psVar13->y).normalized = 1;
          secp256k1_fe_verify(&psVar13->y);
          secp256k1_ge_verify(psVar13);
          return extraout_EAX_08;
        }
        psVar22 = (secp256k1_fe *)(sStack_2e8.z.n + 1);
        psStack_300 = (secp256k1_gej *)0x11a707;
        secp256k1_fe_sqr(psVar22,&sStack_2e8.x);
        psStack_300 = (secp256k1_gej *)0x11a717;
        secp256k1_fe_mul((secp256k1_fe *)(sStack_2e8.y.n + 1),psVar22,&sStack_2e8.x);
        psStack_300 = (secp256k1_gej *)0x11a725;
        secp256k1_fe_mul(&a_04->x,&a_04->x,psVar22);
        psVar18 = (secp256k1_gej *)&a_04->y;
        psStack_300 = (secp256k1_gej *)0x11a737;
        secp256k1_fe_mul((secp256k1_fe *)psVar18,(secp256k1_fe *)psVar18,
                         (secp256k1_fe *)(sStack_2e8.y.n + 1));
        psStack_300 = (secp256k1_gej *)0x11a73f;
        secp256k1_ge_verify(a_04);
        uVar15 = uVar15 + 1;
        a_04 = a_04 + -1;
        psVar16 = psStack_2f8;
      } while (puStack_2f0 != (undefined1 *)uVar15);
    }
    do {
      psStack_300 = (secp256k1_gej *)0x11a761;
      secp256k1_ge_verify(psVar13);
      psVar13 = psVar13 + 1;
      psVar10 = psVar16 + -1;
      psVar16 = (secp256k1_ge *)&psVar10->field_0x67;
      iVar6 = extraout_EAX_01;
    } while (&psVar10->field_0x67 != (undefined1 *)0x0);
  }
  return iVar6;
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    for (bit = 0; bit < len; bit++) {
        wnaf[bit] = 0;
    }

    s = *a;
    if (secp256k1_scalar_get_bits_limb32(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    bit = 0;
    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits_limb32(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}